

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  int iVar3;
  uint8_t uVar4;
  roaring_array_t *prVar5;
  byte bVar6;
  int *c;
  int *piVar7;
  uint8_t uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint32_t cap;
  uint uVar13;
  ushort uVar14;
  uint uVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t uVar19;
  uint8_t result_type;
  uint8_t local_55;
  uint32_t local_54;
  roaring_array_t *local_50;
  uint32_t local_44;
  roaring_bitmap_t *local_40;
  roaring_bitmap_t *local_38;
  
  local_55 = '\0';
  uVar19 = (x1->high_low_container).size;
  local_54 = (x2->high_low_container).size;
  cap = local_54;
  if ((int)uVar19 < (int)local_54) {
    cap = uVar19;
  }
  local_50 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  if (((x1->high_low_container).flags & 1) == 0) {
    bVar6 = 0;
  }
  else {
    bVar6 = (x2->high_low_container).flags & 1;
  }
  local_50->flags = local_50->flags & 0xfe | bVar6;
  if (0 < (int)local_54 && 0 < (int)uVar19) {
    uVar18 = 0;
    uVar11 = 0;
    local_44 = uVar19;
    local_40 = x2;
    local_38 = x1;
    do {
      puVar1 = (x1->high_low_container).keys;
      uVar17 = (uint)uVar18;
      uVar13 = uVar17 & 0xffff;
      uVar16 = puVar1[uVar13];
      puVar2 = (x2->high_low_container).keys;
      uVar10 = (uint)uVar11;
      uVar15 = uVar10 & 0xffff;
      uVar14 = puVar2[uVar15];
      if (uVar16 == uVar14) {
        c = (int *)container_and((x1->high_low_container).containers[uVar13],
                                 (x1->high_low_container).typecodes[uVar13],
                                 (x2->high_low_container).containers[uVar15],
                                 (x2->high_low_container).typecodes[uVar15],&local_55);
        prVar5 = local_50;
        uVar4 = local_55;
        piVar7 = c;
        uVar8 = local_55;
        if (local_55 == '\x04') {
          uVar8 = (uint8_t)c[2];
          if (uVar8 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar7 = *(int **)c;
        }
        if ((uVar8 == '\x03') || (uVar8 == '\x02')) {
          if (*piVar7 < 1) goto LAB_00114a63;
LAB_001149d8:
          extend_array(local_50,1);
          iVar12 = prVar5->size;
          prVar5->keys[iVar12] = uVar16;
          prVar5->containers[iVar12] = c;
          prVar5->typecodes[iVar12] = uVar4;
          prVar5->size = prVar5->size + 1;
        }
        else {
          if (uVar8 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar7 != 0) {
            if (*piVar7 != -1) goto LAB_001149d8;
            lVar9 = 0;
            do {
              if (*(long *)(*(long *)(piVar7 + 2) + lVar9 * 8) != 0) goto LAB_001149d8;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x400);
          }
LAB_00114a63:
          container_free(c,local_55);
        }
        uVar18 = (ulong)(uVar17 + 1);
        uVar11 = (ulong)(uVar10 + 1);
        x2 = local_40;
        x1 = local_38;
        uVar19 = local_44;
      }
      else if (uVar16 < uVar14) {
        uVar10 = (x1->high_low_container).size;
        uVar13 = uVar17 + 1;
        if (((int)uVar13 < (int)uVar10) && (puVar1[(int)uVar13] < uVar14)) {
          uVar17 = uVar17 + 2;
          iVar12 = 1;
          if ((int)uVar17 < (int)uVar10) {
            iVar12 = 1;
            do {
              uVar18 = (ulong)uVar17;
              uVar16 = puVar1[(int)uVar17];
              if (uVar14 <= uVar16) goto LAB_001149b7;
              iVar3 = iVar12 * 2;
              uVar17 = uVar13 + iVar12 * 2;
              iVar12 = iVar3;
            } while ((int)uVar17 < (int)uVar10);
          }
          uVar16 = puVar1[(long)(int)uVar10 + -1];
          uVar18 = (long)(int)uVar10 - 1;
LAB_001149b7:
          if (uVar16 != uVar14) {
            if (uVar16 < uVar14) {
              uVar18 = (ulong)uVar10;
            }
            else if ((iVar12 >> 1) + uVar13 + 1 != (int)uVar18) {
              uVar13 = (iVar12 >> 1) + uVar13;
              do {
                uVar17 = (int)(uVar13 + (int)uVar18) >> 1;
                if (puVar1[(int)uVar17] == uVar14) {
                  uVar18 = (ulong)uVar17;
                  break;
                }
                if (uVar14 <= puVar1[(int)uVar17]) {
                  uVar18 = (ulong)uVar17;
                  uVar17 = uVar13;
                }
                uVar13 = uVar17;
              } while (uVar13 + 1 != (int)uVar18);
            }
          }
        }
        else {
          uVar18 = (ulong)uVar13;
        }
      }
      else {
        uVar17 = (x2->high_low_container).size;
        uVar13 = uVar10 + 1;
        if (((int)uVar13 < (int)uVar17) && (puVar2[(int)uVar13] < uVar16)) {
          uVar10 = uVar10 + 2;
          iVar12 = 1;
          if ((int)uVar10 < (int)uVar17) {
            iVar12 = 1;
            do {
              uVar11 = (ulong)uVar10;
              uVar14 = puVar2[(int)uVar10];
              if (uVar16 <= uVar14) goto LAB_00114a57;
              iVar3 = iVar12 * 2;
              uVar10 = uVar13 + iVar12 * 2;
              iVar12 = iVar3;
            } while ((int)uVar10 < (int)uVar17);
          }
          uVar14 = puVar2[(long)(int)uVar17 + -1];
          uVar11 = (long)(int)uVar17 - 1;
LAB_00114a57:
          if (uVar14 != uVar16) {
            if (uVar14 < uVar16) {
              uVar11 = (ulong)uVar17;
            }
            else if ((iVar12 >> 1) + uVar13 + 1 != (int)uVar11) {
              uVar13 = (iVar12 >> 1) + uVar13;
              do {
                uVar17 = (int)(uVar13 + (int)uVar11) >> 1;
                if (puVar2[(int)uVar17] == uVar16) {
                  uVar11 = (ulong)uVar17;
                  break;
                }
                if (uVar16 <= puVar2[(int)uVar17]) {
                  uVar11 = (ulong)uVar17;
                  uVar17 = uVar13;
                }
                uVar13 = uVar17;
              } while (uVar13 + 1 != (int)uVar11);
            }
          }
        }
        else {
          uVar11 = (ulong)uVar13;
        }
      }
    } while (((int)uVar18 < (int)uVar19) && ((int)uVar11 < (int)local_54));
  }
  return (roaring_bitmap_t *)local_50;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}